

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O0

void __thiscall GMAA_MAA_ELSI::SelectPoliciesToProcessFurther(GMAA_MAA_ELSI *this)

{
  double in_stack_00000038;
  bool in_stack_00000047;
  PartialPolicyPoolInterface_sharedPtr *in_stack_00000048;
  GMAA_MAA_ELSI *in_stack_00000050;
  
  SelectPoliciesToProcessFurther
            (in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038);
  return;
}

Assistant:

void GMAA_MAA_ELSI::SelectPoliciesToProcessFurther(
    const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
    bool are_LBs, double bestLB)
{
    //for MAA*, all policies are processed further when they aren't full
    //policies (i.e. lower bounds)
    //so, unless these are full policies...
    if(are_LBs)
    {
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
    }
    //we can return immediately...
    return;
}